

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function.hpp
# Opt level: O0

AggregateFunction *
duckdb::AggregateFunction::
UnaryAggregate<duckdb::StddevState,double,double,duckdb::StandardErrorOfTheMeanOperation,(duckdb::AggregateDestructorType)0>
          (LogicalType *input_type,LogicalType *return_type,FunctionNullHandling null_handling)

{
  initializer_list<duckdb::LogicalType> iVar1;
  undefined1 in_CL;
  aggregate_finalize_t in_RDX;
  LogicalType *in_RSI;
  AggregateFunction *in_RDI;
  bind_aggregate_function_t unaff_retaddr;
  aggregate_destructor_t in_stack_00000008;
  aggregate_statistics_t in_stack_00000010;
  aggregate_window_t in_stack_00000018;
  aggregate_serialize_t in_stack_00000020;
  aggregate_deserialize_t in_stack_00000028;
  allocator_type *in_stack_fffffffffffffec8;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  size_type in_stack_fffffffffffffee0;
  LogicalType *local_a8;
  AggregateFunction *initialize;
  aggregate_size_t in_stack_ffffffffffffff88;
  LogicalType *in_stack_ffffffffffffff90;
  LogicalType *this;
  AggregateFunction *in_stack_ffffffffffffffa0;
  undefined1 *local_48;
  undefined8 local_40;
  undefined7 in_stack_ffffffffffffffe0;
  FunctionNullHandling null_handling_00;
  AggregateFunction *simple_update;
  
  this = (LogicalType *)&stack0xffffffffffffffa0;
  initialize = in_RDI;
  simple_update = in_RDI;
  duckdb::LogicalType::LogicalType(this,in_RSI);
  null_handling_00 = (FunctionNullHandling)in_RSI;
  local_48 = &stack0xffffffffffffffa0;
  local_40 = 1;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x80dc53);
  iVar1._M_array._4_4_ = in_stack_fffffffffffffedc;
  iVar1._M_array._0_4_ = in_stack_fffffffffffffed8;
  iVar1._M_len = in_stack_fffffffffffffee0;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffed0,iVar1,in_stack_fffffffffffffec8);
  AggregateFunction(in_stack_ffffffffffffffa0,(vector<duckdb::LogicalType,_true> *)this,
                    in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                    (aggregate_initialize_t)initialize,(aggregate_update_t)in_RDI,
                    (aggregate_combine_t)CONCAT17(in_CL,in_stack_ffffffffffffffe0),in_RDX,
                    null_handling_00,(aggregate_simple_update_t)simple_update,unaff_retaddr,
                    in_stack_00000008,in_stack_00000010,in_stack_00000018,in_stack_00000020,
                    in_stack_00000028);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x80dd21);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x80dd2e);
  local_a8 = (LogicalType *)&local_48;
  do {
    local_a8 = local_a8 + -0x18;
    duckdb::LogicalType::~LogicalType(local_a8);
  } while (local_a8 != (LogicalType *)&stack0xffffffffffffffa0);
  return initialize;
}

Assistant:

static AggregateFunction
	UnaryAggregate(const LogicalType &input_type, LogicalType return_type,
	               FunctionNullHandling null_handling = FunctionNullHandling::DEFAULT_NULL_HANDLING) {
		return AggregateFunction({input_type}, return_type, AggregateFunction::StateSize<STATE>,
		                         AggregateFunction::StateInitialize<STATE, OP, destructor_type>,
		                         AggregateFunction::UnaryScatterUpdate<STATE, INPUT_TYPE, OP>,
		                         AggregateFunction::StateCombine<STATE, OP>,
		                         AggregateFunction::StateFinalize<STATE, RESULT_TYPE, OP>, null_handling,
		                         AggregateFunction::UnaryUpdate<STATE, INPUT_TYPE, OP>);
	}